

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O3

void deqp::gls::InteractionTestUtil::computeRandomQuad
               (Random *rnd,IntegerQuad *quad,int targetWidth,int targetHeight)

{
  undefined8 *puVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deBool dVar8;
  deBool dVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  float val;
  float local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  fVar16 = ceilf((float)targetWidth * 0.5);
  iVar15 = (int)fVar16;
  fVar16 = ceilf((float)targetHeight * 0.5);
  iVar4 = (int)fVar16;
  dVar5 = deRandom_getUint32(&rnd->m_rnd);
  if (targetWidth != 0x7fffffff || iVar15 != -0x80000000) {
    dVar5 = dVar5 % ((targetWidth - iVar15) + 1U) + iVar15;
  }
  dVar6 = deRandom_getUint32(&rnd->m_rnd);
  iVar15 = -0x80000000;
  if (targetHeight != 0x7fffffff || iVar4 != -0x80000000) {
    iVar15 = targetHeight + 1;
    dVar6 = dVar6 % (uint)(iVar15 - iVar4) + iVar4;
  }
  dVar7 = deRandom_getUint32(&rnd->m_rnd);
  lVar14 = 0;
  uVar3 = (ulong)dVar7 % (ulong)((targetWidth - dVar5) + 1);
  dVar7 = deRandom_getUint32(&rnd->m_rnd);
  uVar10 = (ulong)dVar7 % (ulong)(iVar15 - dVar6);
  uVar11 = (uint)uVar10;
  dVar8 = deRandom_getBool(&rnd->m_rnd);
  dVar9 = deRandom_getBool(&rnd->m_rnd);
  local_40 = 0.0;
  de::Random::choose<float_const*,float*>
            (rnd,computeRandomQuad::depthValues,getRandomColor::components,&local_40,1);
  fVar16 = local_40;
  uVar2 = (dVar6 - 1) + uVar11;
  if (dVar9 == 1) {
    uVar10 = (ulong)uVar2;
    uVar2 = uVar11;
  }
  uVar11 = (dVar5 - 1) + (int)uVar3;
  uVar13 = uVar3;
  if (dVar8 == 1) {
    uVar13 = (ulong)uVar11;
  }
  uVar12 = (ulong)uVar11;
  if (dVar8 == 1) {
    uVar12 = uVar3;
  }
  *(ulong *)(quad->posA).m_data = uVar13 | uVar10 << 0x20;
  *(ulong *)(quad->posB).m_data = uVar12 | (ulong)uVar2 << 0x20;
  do {
    getRandomColor((InteractionTestUtil *)&local_40,rnd);
    puVar1 = (undefined8 *)((long)quad->color[0].m_data + lVar14);
    *puVar1 = CONCAT44(uStack_3c,local_40);
    puVar1[1] = uStack_38;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x40);
  quad->depth[0] = fVar16;
  quad->depth[1] = fVar16;
  quad->depth[2] = fVar16;
  quad->depth[3] = fVar16;
  return;
}

Assistant:

void computeRandomQuad (de::Random& rnd, gls::FragmentOpUtil::IntegerQuad& quad, int targetWidth, int targetHeight)
{
	// \note In viewport coordinates.
	// \todo [2012-12-18 pyry] Out-of-bounds values.
	// \note Not using depth 1.0 since clearing with 1.0 and rendering with 1.0 may not be same value.
	static const float depthValues[] = { 0.0f, 0.2f, 0.4f, 0.5f, 0.51f, 0.6f, 0.8f, 0.95f };

	const int		maxOutOfBounds		= 0;
	const float		minSize				= 0.5f;

	int minW		= deCeilFloatToInt32(minSize * (float)targetWidth);
	int minH		= deCeilFloatToInt32(minSize * (float)targetHeight);
	int maxW		= targetWidth + 2*maxOutOfBounds;
	int maxH		= targetHeight + 2*maxOutOfBounds;

	int width		= rnd.getInt(minW, maxW);
	int	height		= rnd.getInt(minH, maxH);
	int x			= rnd.getInt(-maxOutOfBounds, targetWidth+maxOutOfBounds-width);
	int y			= rnd.getInt(-maxOutOfBounds, targetHeight+maxOutOfBounds-height);

	bool flipX		= rnd.getBool();
	bool flipY		= rnd.getBool();

	float depth		= rnd.choose<float>(DE_ARRAY_BEGIN(depthValues), DE_ARRAY_END(depthValues));

	quad.posA	= IVec2(flipX ? (x+width-1) : x, flipY ? (y+height-1) : y);
	quad.posB	= IVec2(flipX ? x : (x+width-1), flipY ? y : (y+height-1));

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(quad.color); ndx++)
		quad.color[ndx] = getRandomColor(rnd);

	std::fill(DE_ARRAY_BEGIN(quad.depth), DE_ARRAY_END(quad.depth), depth);
}